

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O2

lzma_ret block_encoder_init(lzma_stream_coder_conflict *coder,lzma_allocator *allocator)

{
  lzma_ret lVar1;
  
  *(undefined4 *)&(coder->block_options).compressed_size = 0xffffffff;
  *(undefined4 *)((long)&(coder->block_options).compressed_size + 4) = 0xffffffff;
  *(undefined4 *)&(coder->block_options).uncompressed_size = 0xffffffff;
  *(undefined4 *)((long)&(coder->block_options).uncompressed_size + 4) = 0xffffffff;
  lVar1 = lzma_block_header_size(&coder->block_options);
  if (lVar1 != LZMA_OK) {
    return lVar1;
  }
  lVar1 = lzma_block_encoder_init(&coder->block_encoder,allocator,&coder->block_options);
  return lVar1;
}

Assistant:

static lzma_ret
block_encoder_init(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	// Prepare the Block options. Even though Block encoder doesn't need
	// compressed_size, uncompressed_size, and header_size to be
	// initialized, it is a good idea to do it here, because this way
	// we catch if someone gave us Filter ID that cannot be used in
	// Blocks/Streams.
	coder->block_options.compressed_size = LZMA_VLI_UNKNOWN;
	coder->block_options.uncompressed_size = LZMA_VLI_UNKNOWN;

	return_if_error(lzma_block_header_size(&coder->block_options));

	// Initialize the actual Block encoder.
	return lzma_block_encoder_init(&coder->block_encoder, allocator,
			&coder->block_options);
}